

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O0

int __thiscall AliHttpRequest::CommitRequestWithBody(AliHttpRequest *this,string *body)

{
  AliConnection *pAVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  string local_78;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  string *psStack_18;
  int ret;
  string *body_local;
  AliHttpRequest *this_local;
  
  local_1c = 0;
  psStack_18 = body;
  body_local = (string *)this;
  bVar2 = std::operator==(&this->method_,"POST");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Content-Length",&local_41);
    uVar5 = std::__cxx11::string::size();
    get_format_string_abi_cxx11_(&local_78,"%d",uVar5);
    AddRequestHeader(this,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  local_1c = (**this->_vptr_AliHttpRequest)();
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    pAVar1 = this->connection_;
    uVar5 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::size();
    (*pAVar1->_vptr_AliConnection[1])(pAVar1,uVar5,(ulong)uVar3);
  }
  return 0;
}

Assistant:

int AliHttpRequest::CommitRequestWithBody(const std::string& body) {
  // todo:check body size
  int ret = 0;

  if(this->method_ == "POST") {
    this->AddRequestHeader("Content-Length", get_format_string("%d", body.size()));
  }
  
  ret = this->CommitRequest();

  if(body.size()) {
    this->connection_->Send((char*)body.c_str(), body.size());
  }
  
  return 0;
}